

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

RAMBlock * qemu_get_ram_block(uc_struct_conflict15 *uc,ram_addr_t addr)

{
  anon_struct_16_2_6a822a49_for_next *paVar1;
  RAMBlock *pRVar2;
  
  pRVar2 = (uc->ram_list).mru_block;
  if ((pRVar2 == (RAMBlock *)0x0) || (pRVar2->max_length <= addr - pRVar2->offset)) {
    paVar1 = (anon_struct_16_2_6a822a49_for_next *)&(uc->ram_list).blocks;
    while( true ) {
      pRVar2 = paVar1->le_next;
      if (pRVar2 == (RAMBlock *)0x0) {
        fprintf(_stderr,"Bad ram offset %lx\n");
        abort();
      }
      if (addr - pRVar2->offset < pRVar2->max_length) break;
      paVar1 = &pRVar2->next;
    }
    (uc->ram_list).mru_block = pRVar2;
  }
  return pRVar2;
}

Assistant:

static RAMBlock *qemu_get_ram_block(struct uc_struct *uc, ram_addr_t addr)
{
    RAMBlock *block;

    block = uc->ram_list.mru_block;
    if (block && addr - block->offset < block->max_length) {
        return block;
    }
    RAMBLOCK_FOREACH(block) {
        if (addr - block->offset < block->max_length) {
            goto found;
        }
    }

    fprintf(stderr, "Bad ram offset %" PRIx64 "\n", (uint64_t)addr);
    abort();

found:
    uc->ram_list.mru_block = block;
    return block;
}